

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int run_using_server_starter(char *h2o_cmd,char *config_file)

{
  listener_config_t *plVar1;
  FILE *pFVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  int *piVar8;
  size_t in_RCX;
  st_h2o_mem_pool_chunk_t *psVar9;
  st_h2o_mem_pool_chunk_t *psVar10;
  char *__format;
  size_t sVar11;
  h2o_iovec_t hVar12;
  h2o_mem_pool_t local_4c8;
  char *local_4a8;
  char *local_4a0;
  undefined1 local_498 [32];
  h2o_iovec_t local_478;
  char *local_468;
  size_t local_460;
  h2o_iovec_t local_458;
  char *local_448;
  size_t local_440;
  char host [1025];
  
  local_4c8.chunks = (st_h2o_mem_pool_chunk_t *)0x0;
  local_4c8.chunk_offset = 0;
  local_4c8.shared_refs = (st_h2o_mem_pool_shared_ref_t *)0x0;
  local_4a8 = h2o_cmd;
  local_4a0 = config_file;
  h2o_vector__reserve(&local_4c8,(h2o_vector_t *)0x8,1,in_RCX);
  pcVar4 = h2o_configurator_get_cmd_path("share/h2o/start_server");
  psVar10 = (st_h2o_mem_pool_chunk_t *)
            ((long)(st_h2o_mem_pool_chunk_t **)local_4c8.chunk_offset + 1);
  *(char **)((local_4c8.chunks)->bytes + local_4c8.chunk_offset * 8 + -0x10) = pcVar4;
  if (conf.pid_file != (char *)0x0) {
    pcVar4 = (char *)((long)(st_h2o_mem_pool_chunk_t **)local_4c8.chunk_offset + 2);
    local_4c8.chunk_offset = (size_t)psVar10;
    h2o_vector__reserve(&local_4c8,(h2o_vector_t *)0x8,(size_t)pcVar4,(size_t)pcVar4);
    pcVar4 = conf.pid_file;
    local_458.base = "--pid-file=";
    local_458.len = 0xb;
    local_440 = strlen(conf.pid_file);
    local_448 = pcVar4;
    hVar12 = h2o_concat_list((h2o_mem_pool_t *)0x0,&local_458,2);
    psVar10 = (st_h2o_mem_pool_chunk_t *)
              ((long)(st_h2o_mem_pool_chunk_t **)local_4c8.chunk_offset + 1);
    *(char **)((local_4c8.chunks)->bytes + local_4c8.chunk_offset * 8 + -0x10) = hVar12.base;
    local_4c8.chunk_offset = (size_t)local_4c8.chunks;
  }
  psVar9 = (st_h2o_mem_pool_chunk_t *)local_4c8.chunk_offset;
  if (conf.error_log != (char *)0x0) {
    local_4c8.chunk_offset = (size_t)psVar10;
    h2o_vector__reserve(&local_4c8,(h2o_vector_t *)0x8,(size_t)((long)&psVar10->next + 1),
                        (size_t)psVar9);
    pcVar4 = conf.error_log;
    local_478.base = "--log-file=";
    local_478.len = 0xb;
    local_460 = strlen(conf.error_log);
    local_468 = pcVar4;
    hVar12 = h2o_concat_list((h2o_mem_pool_t *)0x0,&local_478,2);
    *(char **)((local_4c8.chunks)->bytes + local_4c8.chunk_offset * 8 + -0x10) = hVar12.base;
    psVar9 = local_4c8.chunks;
    psVar10 = (st_h2o_mem_pool_chunk_t *)
              ((long)(st_h2o_mem_pool_chunk_t **)local_4c8.chunk_offset + 1);
  }
  local_4c8.chunk_offset = (size_t)psVar10;
  if (conf.run_mode == RUN_MODE_DAEMON) {
    h2o_vector__reserve(&local_4c8,(h2o_vector_t *)0x8,
                        (size_t)((long)(st_h2o_mem_pool_chunk_t **)local_4c8.chunk_offset + 1),
                        (size_t)psVar9);
    *(char **)((local_4c8.chunks)->bytes + local_4c8.chunk_offset * 8 + -0x10) = "--daemonize";
    psVar9 = (st_h2o_mem_pool_chunk_t *)local_4c8.chunk_offset;
    local_4c8.chunk_offset = (size_t)((long)(st_h2o_mem_pool_chunk_t **)local_4c8.chunk_offset + 1);
  }
  sVar11 = 0;
  do {
    if (sVar11 == conf.num_listeners) {
      h2o_vector__reserve(&local_4c8,(h2o_vector_t *)0x8,
                          (size_t)((long)(st_h2o_mem_pool_chunk_t **)local_4c8.chunk_offset + 5),
                          (size_t)psVar9);
      psVar10 = local_4c8.chunks;
      *(char **)((local_4c8.chunks)->bytes + local_4c8.chunk_offset * 8 + -0x10) = "--";
      *(char **)((local_4c8.chunks)->bytes + local_4c8.chunk_offset * 8 + -8) = local_4a8;
      *(char **)((local_4c8.chunks)->bytes + local_4c8.chunk_offset * 8) = "-c";
      *(char **)((local_4c8.chunks)->bytes + local_4c8.chunk_offset * 8 + 8) = local_4a0;
      pcVar4 = (local_4c8.chunks)->bytes + local_4c8.chunk_offset * 8 + 0x10;
      pcVar4[0] = '\0';
      pcVar4[1] = '\0';
      pcVar4[2] = '\0';
      pcVar4[3] = '\0';
      pcVar4[4] = '\0';
      pcVar4[5] = '\0';
      pcVar4[6] = '\0';
      pcVar4[7] = '\0';
      setenv("H2O_VIA_MASTER","",1);
      execvp((char *)psVar10->next,(char **)psVar10);
      pFVar2 = _stderr;
      psVar10 = psVar10->next;
      piVar8 = __errno_location();
      pcVar4 = strerror(*piVar8);
      iVar3 = fprintf(pFVar2,"failed to spawn %s:%s\n",psVar10,pcVar4);
      return iVar3;
    }
    plVar1 = conf.listeners[sVar11];
    if ((plVar1->addr).ss_family == 1) {
      pcVar7 = (plVar1->addr).__ss_padding;
      sVar5 = strlen(pcVar7);
      pcVar4 = (char *)h2o_mem_alloc(sVar5 + 8);
      sprintf(pcVar4,"--path=%s",pcVar7);
    }
    else {
      iVar3 = getnameinfo((sockaddr *)&plVar1->addr,plVar1->addrlen,host,0x401,(char *)local_498,
                          0x20,3);
      pFVar2 = _stderr;
      if (iVar3 != 0) {
        pcVar4 = gai_strerror(iVar3);
        fprintf(pFVar2,"failed to stringify the address of %zu-th listen directive:%s\n",sVar11,
                pcVar4);
        exit(0x47);
      }
      sVar5 = strlen(host);
      sVar6 = strlen((char *)local_498);
      pcVar4 = (char *)h2o_mem_alloc(sVar5 + sVar6 + 0xb);
      pcVar7 = strchr(host,0x3a);
      __format = "--port=[%s]:%s";
      if (pcVar7 == (char *)0x0) {
        __format = "--port=%s:%s";
      }
      psVar9 = (st_h2o_mem_pool_chunk_t *)local_498;
      sprintf(pcVar4,__format,host);
    }
    h2o_vector__reserve(&local_4c8,(h2o_vector_t *)0x8,
                        (size_t)((long)(st_h2o_mem_pool_chunk_t **)local_4c8.chunk_offset + 1),
                        (size_t)psVar9);
    *(char **)((local_4c8.chunks)->bytes + local_4c8.chunk_offset * 8 + -0x10) = pcVar4;
    sVar11 = sVar11 + 1;
    psVar9 = (st_h2o_mem_pool_chunk_t *)local_4c8.chunk_offset;
    local_4c8.chunk_offset = (size_t)((long)(st_h2o_mem_pool_chunk_t **)local_4c8.chunk_offset + 1);
  } while( true );
}

Assistant:

static int run_using_server_starter(const char *h2o_cmd, const char *config_file)
{
    char **args = build_server_starter_argv(h2o_cmd, config_file);
    setenv("H2O_VIA_MASTER", "", 1);
    execvp(args[0], args);
    fprintf(stderr, "failed to spawn %s:%s\n", args[0], strerror(errno));
    return EX_CONFIG;
}